

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

void __thiscall MeCab::Param::set<int>(Param *this,char *key,int *value,bool rewrite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  iterator iVar3;
  long *plVar4;
  istream *piVar5;
  mapped_type *this_00;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  string key2;
  stringstream interpreter;
  undefined1 local_190 [376];
  
  std::__cxx11::string::string((string *)&key2,key,(allocator *)&interpreter);
  if ((int)CONCAT71(in_register_00000009,rewrite) == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->conf_)._M_t,&key2);
    if ((_Rb_tree_header *)iVar3._M_node != &(this->conf_)._M_t._M_impl.super__Rb_tree_header)
    goto LAB_0016e158;
  }
  iVar2 = *value;
  std::__cxx11::stringstream::stringstream((stringstream *)&interpreter);
  paVar1 = &result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)paVar1;
  plVar4 = (long *)std::ostream::operator<<(local_190,iVar2);
  if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    piVar5 = std::operator>>((istream *)&interpreter,(string *)&result);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0016e0d4;
    piVar5 = std::ws<char,std::char_traits<char>>((istream *)&interpreter);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 2) == 0) goto LAB_0016e0d4;
    local_1e0 = &local_1d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p == paVar1) {
      local_1d0._8_8_ = result.field_2._8_8_;
    }
    else {
      local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)result._M_dataplus._M_p;
    }
    local_1d0._M_allocated_capacity._1_7_ = result.field_2._M_allocated_capacity._1_7_;
    local_1d0._M_local_buf[0] = result.field_2._M_local_buf[0];
    local_1d8 = result._M_string_length;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    result._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
LAB_0016e0d4:
    local_1f0.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    ((local_1f0.ptr_)->_M_dataplus)._M_p = (pointer)&(local_1f0.ptr_)->field_2;
    (local_1f0.ptr_)->_M_string_length = 0;
    ((local_1f0.ptr_)->field_2)._M_local_buf[0] = '\0';
    local_1f0._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019ecf8;
    std::__cxx11::string::string((string *)&local_1e0,(string *)local_1f0.ptr_);
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_1f0);
  }
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::stringstream::~stringstream((stringstream *)&interpreter);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->conf_,&key2);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
LAB_0016e158:
  std::__cxx11::string::~string((string *)&key2);
  return;
}

Assistant:

void set(const char* key, const T &value,
           bool rewrite = true) {
    std::string key2 = std::string(key);
    if (rewrite || (!rewrite && conf_.find(key2) == conf_.end()))
      conf_[key2] = lexical_cast<std::string, T>(value);
  }